

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibBase.cpp
# Opt level: O0

int lib::base::Require(State *state)

{
  bool bVar1;
  State *in_RDI;
  String *in_stack_00000008;
  string module;
  StackAPI api;
  string *module_name;
  ValueT in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  StackAPI *in_stack_ffffffffffffffb8;
  State *in_stack_ffffffffffffffc0;
  StackAPI local_20;
  int local_4;
  
  luna::StackAPI::StackAPI(&local_20,in_RDI);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  if (bVar1) {
    luna::StackAPI::GetString(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    module_name = (string *)&stack0xffffffffffffffc0;
    luna::String::GetStdString_abi_cxx11_(in_stack_00000008);
    bVar1 = luna::State::IsModuleLoaded
                      ((State *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       module_name);
    if (!bVar1) {
      luna::State::DoModule(in_stack_ffffffffffffffc0,(string *)in_stack_ffffffffffffffb8);
    }
    local_4 = 0;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Require(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_String))
            return 0;

        auto module = api.GetString(0)->GetStdString();
        if (!state->IsModuleLoaded(module))
            state->DoModule(module);

        return 0;
    }